

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
Graph<std::pair<double,_double>_>::dfsVisit
          (Graph<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *v,
          vector<int,_std::allocator<int>_> *res)

{
  bool bVar1;
  reference ppEVar2;
  Edge<std::pair<double,_double>_> *edge;
  iterator __end0;
  iterator __begin0;
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  *__range1;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *res_local;
  Vertex<std::pair<double,_double>_> *v_local;
  Graph<std::pair<double,_double>_> *this_local;
  
  v->visited = true;
  local_20 = res;
  res_local = (vector<int,_std::allocator<int>_> *)v;
  v_local = (Vertex<std::pair<double,_double>_> *)this;
  __range1._4_4_ = Vertex<std::pair<double,_double>_>::getId(v);
  std::vector<int,_std::allocator<int>_>::push_back
            (res,(value_type_conflict *)((long)&__range1 + 4));
  Vertex<std::pair<double,_double>_>::getAdj
            ((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
              *)&__begin0,(Vertex<std::pair<double,_double>_> *)res_local);
  __end0 = std::
           vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
           ::begin((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                    *)&__begin0);
  edge = (Edge<std::pair<double,_double>_> *)
         std::
         vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
         ::end((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                *)&__begin0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
                                *)&edge);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
              ::operator*(&__end0);
    if (((*ppEVar2)->dest->visited & 1U) == 0) {
      dfsVisit(this,(*ppEVar2)->dest,local_20);
    }
    __gnu_cxx::
    __normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  ~vector((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
           *)&__begin0);
  return;
}

Assistant:

void Graph<T>::dfsVisit(Vertex<T> *v, vector<int> &res) const {
    v->visited = true;
    res.push_back(v->getId());
    for (auto edge : v->getAdj()) {
        if (!edge->dest->visited) { dfsVisit(edge->dest, res); }
    }
}